

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O3

void __thiscall
tchecker::clock_updates_visitor_t::update_int_to_clock_inside_loop
          (clock_updates_visitor_t *this,typed_lvalue_expression_t *x,
          shared_ptr<const_tchecker::expression_t> *c)

{
  bool bVar1;
  range_t<unsigned_int,_unsigned_int> rVar2;
  clock_updates_list_t *pcVar3;
  uint uVar4;
  clock_id_t z;
  clock_update_t x_upd;
  clock_update_t cStack_38;
  
  rVar2 = extract_lvalue_variable_ids(x);
  bVar1 = has_const_value((c->
                          super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr);
  uVar4 = rVar2._end;
  if (bVar1) {
    clock_update_t::clock_update_t(&cStack_38,0x7fffffff,c);
    if (rVar2._begin != uVar4) {
      do {
        pcVar3 = clock_updates_map_t::operator[](&this->_u,rVar2._begin);
        clock_updates_list_t::absorbing_push_back(pcVar3,&cStack_38);
        rVar2._begin = rVar2._begin + 1;
        rVar2._end = 0;
      } while (uVar4 != rVar2._begin);
    }
    if (cStack_38._value.
        super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (cStack_38._value.
                 super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else if (rVar2._begin != uVar4) {
    do {
      pcVar3 = clock_updates_map_t::operator[](&this->_u,rVar2._begin);
      clock_updates_list_t::clear(pcVar3);
      rVar2._begin = rVar2._begin + 1;
      rVar2._end = 0;
    } while (uVar4 != rVar2._begin);
  }
  return;
}

Assistant:

void update_int_to_clock_inside_loop(tchecker::typed_lvalue_expression_t const & x,
                                       std::shared_ptr<tchecker::expression_t const> const & c)
  {
    tchecker::range_t<tchecker::variable_id_t> x_instances = tchecker::extract_lvalue_variable_ids(x);
    if (tchecker::has_const_value(*c)) {
      tchecker::clock_update_t x_upd{tchecker::REFCLOCK_ID, c};
      for (tchecker::clock_id_t z = x_instances.begin(); z != x_instances.end(); ++z)
        _u[z].absorbing_push_back(x_upd);
    }
    else {
      for (tchecker::clock_id_t z = x_instances.begin(); z != x_instances.end(); ++z)
        _u[z].clear();
    }
  }